

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O0

void check_tutorial_farlook(int x,int y)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  rm *prVar4;
  monst *local_40;
  monst *local_38;
  obj *otmp;
  monst *mtmp;
  int monid;
  rm *l;
  int y_local;
  int x_local;
  
  prVar4 = level->locations[x] + y;
  if (flags.tutorial != '\0') {
    if ((*(uint *)&prVar4->field_0x6 >> 3 & 1) == 0) {
      iVar3 = dbuf_get_mon(x,y);
      if (iVar3 != 0) {
        if ((level->monsters[x][y] == (monst *)0x0) ||
           ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
          local_38 = (monst *)0x0;
        }
        else {
          local_38 = level->monsters[x][y];
        }
        if (local_38 != (monst *)0x0) {
          if ((level->monsters[x][y] == (monst *)0x0) ||
             ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
            local_40 = (monst *)0x0;
          }
          else {
            local_40 = level->monsters[x][y];
          }
          if ((local_40 != (monst *)0x0) &&
             (((local_40->mtame != '\0' &&
               (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
                ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0'))))
               )) || (((x == u.ux && (y == u.uy)) && (u.usteed != (monst *)0x0)))))) {
            check_tutorial_message(0xd2);
            return;
          }
          if (((local_40 != (monst *)0x0) && ((*(uint *)&local_40->field_0x60 >> 0x16 & 1) != 0)) &&
             ((u.uprops[0x23].intrinsic == 0 ||
              ((u.uprops[0x24].extrinsic != 0 ||
               ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))))
              ))) {
            check_tutorial_message(0xd4);
            return;
          }
          if ((x == u.ux) && (y == u.uy)) {
            return;
          }
          check_tutorial_message(0xd3);
          return;
        }
      }
      poVar1 = level->objects[x][y];
      if (poVar1 == (obj *)0x0) {
        if ((((undefined1  [12])*prVar4 & (undefined1  [12])0x3f) != (undefined1  [12])0x0) ||
           ((*(uint *)prVar4 >> 6 & 0x1f) != 0)) {
          check_tutorial_location(x,y,'\x01');
        }
      }
      else {
        check_tutorial_oclass((int)poVar1->oclass);
      }
    }
    else {
      check_tutorial_message(0xd5);
    }
  }
  return;
}

Assistant:

void check_tutorial_farlook(int x, int y)
{
	const struct rm *l = &level->locations[x][y];
	int monid;
	const struct monst *mtmp;
	const struct obj *otmp;

	if (!flags.tutorial) return; /* short-circuit */

	/* Monsters */
	if (l->mem_invis) {
	    check_tutorial_message(QT_T_LOOK_INVISIBLE);
	    return;
	}

	monid = dbuf_get_mon(x, y) - 1;
	if (monid != -1 && (mtmp = m_at(level, x, y))) {
	    mtmp = m_at(level, x, y);
	    if (mtmp &&
		((mtmp->mtame && !Hallucination) ||
		 /* riding implies tameness */
		 (x == u.ux && y == u.uy && u.usteed))) {
		check_tutorial_message(QT_T_LOOK_TAME);
	    } else if (mtmp && mtmp->mpeaceful && !Hallucination) {
		check_tutorial_message(QT_T_LOOK_PEACEFUL);
	    } else if (x == u.ux && y == u.uy) {
		/* looking at yourself, no message yet */
	    } else {
		check_tutorial_message(QT_T_LOOK_HOSTILE);
	    }
	    return;
	}

	/* Items */
	otmp = vobj_at(x, y);
	if (otmp) {
	    check_tutorial_oclass(otmp->oclass);
	    return;
	}

	/* Terrain */
	if (l->mem_bg || l->mem_trap) {
	    check_tutorial_location(x, y, TRUE);
	    return;
	}
}